

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  size_t *this;
  int iVar1;
  istream *this_00;
  ostream *poVar2;
  ulong uVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  long lVar6;
  size_t j;
  pointer pcVar7;
  size_t c;
  long lVar8;
  undefined1 local_f0 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> char2index;
  size_type *local_a0;
  string text;
  size_type *local_78;
  string line;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  letters;
  int local_38;
  uint local_34;
  int width;
  int height;
  
  local_a0 = &text._M_string_length;
  text._M_dataplus._M_p = (pointer)0x0;
  text._M_string_length._0_1_ = 0;
  this_00 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_38);
  std::istream::operator>>(this_00,(int *)&local_34);
  std::istream::ignore();
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_a0);
  line.field_2._8_8_ = 0;
  char2index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&char2index;
  char2index._M_t._M_impl._0_4_ = 0;
  char2index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  char2index._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  char2index._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  char2index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       char2index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::resize((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)((long)&line.field_2 + 8),0x1b);
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&local_a0);
  std::endl<char,std::char_traits<char>>(poVar2);
  this = &char2index._M_t._M_impl.super__Rb_tree_header._M_node_count;
  for (lVar6 = 0; uVar3 = (ulong)(int)local_34, lVar6 < (long)uVar3; lVar6 = lVar6 + 1) {
    local_78 = &line._M_string_length;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length._0_1_ = 0;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_78);
    lVar8 = 0;
    uVar3 = 0;
    while( true ) {
      if ((ulong)((long)-line.field_2._8_8_ / 0x18) <= uVar3) break;
      if (lVar6 == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(line.field_2._8_8_ + lVar8),(long)(int)local_34);
        char2index._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (int)"ABCDEFGHIJKLMNOPQRSTUVWXYZ?"[uVar3];
        pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)local_f0,(key_type *)this);
        *pmVar4 = (mapped_type)uVar3;
      }
      std::__cxx11::string::substr((ulong)this,(ulong)&local_78);
      std::__cxx11::string::operator=
                ((string *)(*(long *)(line.field_2._8_8_ + lVar8) + lVar6 * 0x20),(string *)this);
      std::__cxx11::string::~string((string *)this);
      uVar3 = uVar3 + 1;
      lVar8 = lVar8 + 0x18;
    }
    std::__cxx11::string::~string((string *)&local_78);
  }
  for (lVar6 = 0; lVar6 < (int)uVar3; lVar6 = lVar6 + 1) {
    for (lVar8 = 0; lVar8 != 0x288; lVar8 = lVar8 + 0x18) {
      std::operator<<((ostream *)&std::cerr,
                      (string *)(*(long *)(line.field_2._8_8_ + lVar8) + lVar6 * 0x20));
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    uVar3 = (ulong)local_34;
  }
  lVar6 = 0;
  while (lVar6 < (int)uVar3) {
    text.field_2._8_8_ = lVar6;
    for (pcVar7 = (pointer)0x0; pcVar7 < text._M_dataplus._M_p; pcVar7 = pcVar7 + 1) {
      iVar1 = toupper((int)*(char *)((long)local_a0 + (long)pcVar7));
      local_78 = (size_type *)CONCAT44(local_78._4_4_,iVar1);
      iVar5 = std::
              _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
              ::find((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                      *)local_f0,(key_type *)&local_78);
      if (iVar5._M_node == (_Base_ptr)&char2index) {
        char2index._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0x3f;
        pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)local_f0,
                            (key_type *)&char2index._M_t._M_impl.super__Rb_tree_header._M_node_count
                           );
        std::operator<<((ostream *)&std::cout,
                        (string *)
                        (*(long *)(line.field_2._8_8_ + (long)*pmVar4 * 0x18) + lVar6 * 0x20));
      }
      else {
        pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)local_f0,(key_type *)&local_78);
        std::operator<<((ostream *)&std::cout,
                        (string *)
                        (*(long *)(line.field_2._8_8_ + (long)*pmVar4 * 0x18) + lVar6 * 0x20));
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    uVar3 = (ulong)local_34;
    lVar6 = text.field_2._8_8_ + 1;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_f0);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)((long)&line.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_a0);
  return 0;
}

Assistant:

int main()
{
        int width, height;
        std::string text;
        std::cin >> width >> height;
        std::cin.ignore();
        getline(std::cin, text);

        char chars[] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ?";
        std::vector<std::vector<std::string> > letters;
        std::map<int, int> char2index;
        letters.resize(strlen(chars));
        std::cerr << text << std::endl;
        for (int l = 0; l < height; l++)
        {
                std::string line;
                getline(std::cin, line);
                //std::cerr << line << std::endl;

                for (size_t c = 0; c < letters.size(); c++)
                {
                    if (0 == l)
                    {
                        letters[c].resize(height);
                        char2index[chars[c]] = c;
                    }
                    letters[c][l] = line.substr(c*width, width);
                }
        }

        for (int l = 0; l < height; l++)
        {
            for (size_t c = 0; c < strlen(chars); c++)
            {
                std::cerr << letters[c][l];
            }
            std::cerr << std::endl;
        }

        for (int i = 0; i < height; i++)
        {
            for (size_t j = 0; j < text.length(); j++)
            {
                int c = toupper(text[j]);
                if (char2index.find(c) != char2index.end())
                {
                    std::cout << letters[char2index[c]][i];
                } else
                {
                    std::cout << letters[char2index['?']][i];
                }
            }
            std::cout << std::endl;
        }

        return 0;
}